

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void CopyPortal(int sectortag,int plane,uint pnum,double alpha,bool tolines)

{
  int iVar1;
  FSectorTagIterator local_3c;
  FSectorTagIterator itr_1;
  int j;
  FSectorTagIterator itr;
  int s;
  bool tolines_local;
  double alpha_local;
  uint pnum_local;
  int plane_local;
  int sectortag_local;
  
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&itr_1.start,sectortag);
  while (iVar1 = FSectorTagIterator::Next((FSectorTagIterator *)&itr_1.start), -1 < iVar1) {
    SetPortal((sector_t *)(sectors + iVar1),plane,pnum,alpha);
  }
  for (itr_1.searchtag = 0; itr_1.searchtag < numlines; itr_1.searchtag = itr_1.searchtag + 1) {
    if ((((lines[itr_1.searchtag].special == 0x39) && (lines[itr_1.searchtag].args[1] == 1)) &&
        ((lines[itr_1.searchtag].args[2] == plane || (lines[itr_1.searchtag].args[2] == 3)))) &&
       (lines[itr_1.searchtag].args[3] == sectortag)) {
      if (lines[itr_1.searchtag].args[0] == 0) {
        SetPortal((sector_t *)lines[itr_1.searchtag].frontsector,plane,pnum,alpha);
      }
      else {
        FSectorTagIterator::FSectorTagIterator(&local_3c,lines[itr_1.searchtag].args[0]);
        while (iVar1 = FSectorTagIterator::Next(&local_3c), -1 < iVar1) {
          SetPortal((sector_t *)(sectors + iVar1),plane,pnum,alpha);
        }
      }
    }
  }
  return;
}

Assistant:

static void CopyPortal(int sectortag, int plane, unsigned pnum, double alpha, bool tolines)
{
	int s;
	FSectorTagIterator itr(sectortag);
	while ((s = itr.Next()) >= 0)
	{
		SetPortal(&sectors[s], plane, pnum, alpha);
	}

	for (int j=0;j<numlines;j++)
	{
		// Check if this portal needs to be copied to other sectors
		// This must be done here to ensure that it gets done only after the portal is set up
		if (lines[j].special == Sector_SetPortal &&
			lines[j].args[1] == 1 &&
			(lines[j].args[2] == plane || lines[j].args[2] == 3) &&
			lines[j].args[3] == sectortag)
		{
			if (lines[j].args[0] == 0)
			{
				SetPortal(lines[j].frontsector, plane, pnum, alpha);
			}
			else
			{
				FSectorTagIterator itr(lines[j].args[0]);
				while ((s = itr.Next()) >= 0)
				{
					SetPortal(&sectors[s], plane, pnum, alpha);
				}
			}
		}
	}
}